

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O2

Real __thiscall
amrex::SplineDistFcnElement2d::dist
          (SplineDistFcnElement2d *this,RealVect pt,Real x0,Real x1,Real Dx0,Real Dx1,Real y0,
          Real y1,Real Dy0,Real Dy1,Real *t,RealVect *spt)

{
  Real RVar1;
  Real RVar2;
  
  RVar1 = eval(this,*t,x0,x1,Dx0,Dx1);
  spt->vect[0] = RVar1;
  RVar2 = eval(this,*t,y0,y1,Dy0,Dy1);
  spt->vect[1] = RVar2;
  return SQRT((RVar1 - pt.vect[0]) * (RVar1 - pt.vect[0]) +
              (RVar2 - pt.vect[1]) * (RVar2 - pt.vect[1]));
}

Assistant:

amrex::Real SplineDistFcnElement2d::dist(amrex::RealVect pt,
                           amrex::Real x0, amrex::Real x1,
                           amrex::Real Dx0, amrex::Real Dx1,
                           amrex::Real y0, amrex::Real y1,
                           amrex::Real Dy0, amrex::Real Dy1,
                           amrex::Real& t,
                           amrex::RealVect& spt) const {
  amrex::RealVect delta;
  spt[0] = eval(t, x0, x1, Dx0, Dx1);
  spt[1] = eval(t, y0, y1, Dy0, Dy1);

  delta = spt - pt;

  amrex::Real dist;
  dist = sqrt(delta[0]*delta[0] + delta[1]*delta[1]);

  return dist;
}